

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IAbstractReader.cpp
# Opt level: O0

int __thiscall IAbstractReader::readBase(IAbstractReader *this,string *str)

{
  int iVar1;
  int iVar2;
  streamoff sVar3;
  long lVar4;
  fpos local_38 [16];
  int local_28;
  int local_24;
  int base_pos;
  int ret;
  string *str_local;
  IAbstractReader *this_local;
  
  local_24 = 0;
  _base_pos = str;
  str_local = (string *)this;
  std::__cxx11::string::clear();
  iVar1 = prepare(this);
  local_24 = iVar1 + local_24;
  local_38 = (fpos  [16])std::istream::tellg();
  sVar3 = std::fpos::operator_cast_to_long(local_38);
  local_28 = (int)sVar3;
  (**this->_vptr_IAbstractReader)(this,_base_pos);
  lVar4 = std::__cxx11::string::length();
  if (lVar4 == 0) {
    setPos(this,local_28);
    this_local._4_4_ = 0;
  }
  else {
    iVar2 = std::__cxx11::string::length();
    iVar1 = local_28;
    local_24 = local_24 + iVar2;
    iVar2 = std::__cxx11::string::length();
    setPos(this,iVar1 + iVar2);
    this_local._4_4_ = local_24;
  }
  return this_local._4_4_;
}

Assistant:

int IAbstractReader::readBase(std::string& str) {
    int ret=0;
    str.clear();
    ret+=prepare();
    int base_pos = m_ifs->tellg();
    getWord(str);
    if(!str.length())
    {
        setPos(base_pos);
        return 0;
    }
    ret+=str.length();
    setPos(base_pos+str.length());
    return ret;
}